

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O3

PClassActor * FindClassTentative(char *name,PClass *ancestor,bool optional)

{
  byte *pbVar1;
  int iVar2;
  PClassActor *pPVar3;
  PClassActor *pPVar4;
  FName local_2c;
  
  if (((name == (char *)0x0) || (*name == '\0')) || (iVar2 = strcasecmp(name,"none"), iVar2 == 0)) {
    pPVar3 = (PClassActor *)0x0;
  }
  else {
    local_2c.Index = FName::NameManager::FindName(&FName::NameData,name,false);
    pPVar3 = (PClassActor *)PClass::FindClassTentative(ancestor,&local_2c);
    if (pPVar3 == (PClassActor *)0x0) {
      __assert_fail("cls != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                    ,0x5b,"PClassActor *FindClassTentative(const char *, PClass *, bool)");
    }
    pPVar4 = pPVar3;
    if (pPVar3 != (PClassActor *)ancestor) {
      do {
        pPVar4 = (PClassActor *)(pPVar4->super_PClass).ParentClass;
        if (pPVar4 == (PClassActor *)ancestor) break;
      } while (pPVar4 != (PClassActor *)0x0);
      if (pPVar4 == (PClassActor *)0x0) {
        I_Error("%s does not inherit from %s\n",name,
                FName::NameData.NameArray
                [(ancestor->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index].Text
               );
      }
    }
    if (optional &&
        *(int *)((long)&(pPVar3->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                        super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x24) == -1)
    {
      pbVar1 = (byte *)((long)&(pPVar3->super_PClass).super_PNativeStruct.super_PStruct.
                               super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase.
                               super_DObject + 0x21);
      *pbVar1 = *pbVar1 | 8;
    }
  }
  return pPVar3;
}

Assistant:

static PClassActor *FindClassTentative(const char *name, PClass *ancestor, bool optional = false)
{
	// "" and "none" mean 'no class'
	if (name == NULL || *name == 0 || !stricmp(name, "none"))
	{
		return NULL;
	}

	PClass *cls = ancestor->FindClassTentative(name);
	assert(cls != NULL);	// cls can not be NULL here
	if (!cls->IsDescendantOf(ancestor))
	{
		I_Error("%s does not inherit from %s\n", name, ancestor->TypeName.GetChars());
	}
	if (cls->Size == TentativeClass && optional)
	{
		cls->ObjectFlags |= OF_Transient;	// since this flag has no meaning in class types, let's use it for marking the type optional.
	}
	return static_cast<PClassActor *>(cls);
}